

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# node.c
# Opt level: O2

int ixmlNode_setNodeValue(IXML_Node_conflict *nodeptr,char *newNodeValue)

{
  char *pcVar1;
  
  if (nodeptr == (IXML_Node_conflict *)0x0) {
    return 0x69;
  }
  if (nodeptr->nodeValue != (char *)0x0) {
    free(nodeptr->nodeValue);
    nodeptr->nodeValue = (char *)0x0;
  }
  if (newNodeValue != (char *)0x0) {
    pcVar1 = strdup(newNodeValue);
    nodeptr->nodeValue = pcVar1;
    if (pcVar1 == (char *)0x0) {
      return 0x66;
    }
  }
  return 0;
}

Assistant:

int ixmlNode_setNodeValue(IXML_Node *nodeptr, const char *newNodeValue)
{
	int rc = IXML_SUCCESS;

	if (nodeptr == NULL) {
		return IXML_INVALID_PARAMETER;
	}

	if (nodeptr->nodeValue != NULL) {
		free(nodeptr->nodeValue);
		nodeptr->nodeValue = NULL;
	}

	if (newNodeValue != NULL) {
		nodeptr->nodeValue = strdup(newNodeValue);
		if (nodeptr->nodeValue == NULL) {
			return IXML_INSUFFICIENT_MEMORY;
		}
	}

	return rc;
}